

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsd.cpp
# Opt level: O0

image_char new_image_char_ini(uint xsize,uint ysize,uchar fill_value)

{
  image_char piVar1;
  uint local_28;
  uint i;
  uint N;
  image_char image;
  uchar fill_value_local;
  uint ysize_local;
  uint xsize_local;
  
  piVar1 = new_image_char(xsize,ysize);
  if ((piVar1 == (image_char)0x0) || (piVar1->data == (uchar *)0x0)) {
    error("new_image_char_ini: invalid image.");
  }
  for (local_28 = 0; local_28 < xsize * ysize; local_28 = local_28 + 1) {
    piVar1->data[local_28] = fill_value;
  }
  return piVar1;
}

Assistant:

image_char new_image_char_ini( unsigned int xsize, unsigned int ysize,
                               unsigned char fill_value )
{
    image_char image = new_image_char(xsize, ysize); /* create image */
    unsigned int N = xsize * ysize;
    unsigned int i;

    /* check parameters */
    if ( image == NULL || image->data == NULL )
        error("new_image_char_ini: invalid image.");

    /* initialize */
    for (i = 0; i < N; i++) image->data[i] = fill_value;

    return image;
}